

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawingprimitive_sse2_p.h
# Opt level: O0

QRgb qUnpremultiply_sse4(QRgb p)

{
  undefined1 auVar1 [16];
  uint uVar2;
  QRgb in_EDI;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  float in_XMM2_Da;
  __m128 a;
  __m128i vl;
  __m128 va;
  uint alpha;
  __m128 via;
  undefined8 local_138;
  undefined8 uStack_130;
  short local_114;
  QRgb local_10c;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = qAlpha(in_EDI);
  local_10c = in_EDI;
  if (uVar2 != 0xff) {
    if (uVar2 == 0) {
      local_10c = 0;
    }
    else {
      a[1] = (float)uVar2;
      a[0] = (float)uVar2;
      local_18 = -NAN;
      fStack_14 = -NAN;
      fStack_10 = -NAN;
      fStack_c = -NAN;
      a[2] = 255.0;
      a[3] = 0.0;
      reciprocal_mul_ss((__m128 *)&local_18,a,in_XMM2_Da);
      auVar3 = pmovzxbd(ZEXT416(in_EDI),in_EDI);
      local_a8 = auVar3._0_4_;
      iStack_a4 = auVar3._4_4_;
      iStack_a0 = auVar3._8_4_;
      iStack_9c = auVar3._12_4_;
      local_138 = CONCAT44((int)((float)iStack_a4 * fStack_14),(int)((float)local_a8 * local_18));
      uStack_130._0_4_ = (int)((float)iStack_a0 * fStack_10);
      uStack_130._4_4_ = (int)((float)iStack_9c * fStack_c);
      auVar1._8_8_ = uStack_130;
      auVar1._0_8_ = local_138;
      auVar3._8_8_ = uStack_130;
      auVar3._0_8_ = local_138;
      auVar3 = packusdw(auVar1,auVar3);
      local_114 = (short)uVar2;
      local_b8 = auVar3._0_2_;
      sStack_b6 = auVar3._2_2_;
      sStack_b4 = auVar3._4_2_;
      local_138._0_4_ =
           CONCAT13((0 < local_114) * (local_114 < 0x100) * (char)uVar2 - (0xff < local_114),
                    CONCAT12((0 < sStack_b4) * (sStack_b4 < 0x100) * auVar3[4] - (0xff < sStack_b4),
                             CONCAT11((0 < sStack_b6) * (sStack_b6 < 0x100) * auVar3[2] -
                                      (0xff < sStack_b6),
                                      (0 < local_b8) * (local_b8 < 0x100) * auVar3[0] -
                                      (0xff < local_b8))));
      local_10c = (QRgb)local_138;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10c;
}

Assistant:

static inline QRgb qUnpremultiply_sse4(QRgb p)
{
    const uint alpha = qAlpha(p);
    if (alpha == 255)
        return p;
    if (alpha == 0)
        return 0;
    const __m128 va = _mm_set1_ps(alpha);
    __m128 via;
    reciprocal_mul_ss(via, va, 255.0f); // Approximate 1/a
    __m128i vl = _mm_cvtepu8_epi32(_mm_cvtsi32_si128(p));
    vl = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(vl), via));
    vl = _mm_packus_epi32(vl, vl);
    vl = _mm_insert_epi16(vl, alpha, 3);
    vl = _mm_packus_epi16(vl, vl);
    return _mm_cvtsi128_si32(vl);
}